

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ParamSpec::MergeFrom(ParamSpec *this,ParamSpec *from)

{
  uint uVar1;
  LogMessage *other;
  string *default_value;
  InternalMetadataWithArena *this_00;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  ParamSpec *local_78;
  ParamSpec *from_local;
  ParamSpec *this_local;
  InternalMetadataWithArena *local_60;
  InternalMetadataWithArena *local_58;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x2f23);
    local_b1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_b0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (ParamSpec *)&local_78->_internal_metadata_;
  local_60 = this_00;
  local_58 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,&local_28->unknown_fields);
  }
  local_38 = &local_78->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->name_,default_value,(local_78->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      this->share_mode_ = local_78->share_mode_;
    }
    if ((uVar1 & 4) != 0) {
      this->lr_mult_ = local_78->lr_mult_;
    }
    if ((uVar1 & 8) != 0) {
      this->decay_mult_ = local_78->decay_mult_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void ParamSpec::MergeFrom(const ParamSpec& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.ParamSpec)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 15u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      share_mode_ = from.share_mode_;
    }
    if (cached_has_bits & 0x00000004u) {
      lr_mult_ = from.lr_mult_;
    }
    if (cached_has_bits & 0x00000008u) {
      decay_mult_ = from.decay_mult_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}